

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm2_sig.c
# Opt level: O0

void * sm2sig_dupctx(void *vpsm2ctx)

{
  int iVar1;
  EVP_MD *md;
  EVP_MD_CTX *pEVar2;
  undefined1 *puVar3;
  void *in_RDI;
  PROV_SM2_CTX_conflict *dstctx;
  PROV_SM2_CTX_conflict *srcctx;
  undefined8 in_stack_ffffffffffffffe0;
  
  md = (EVP_MD *)
       CRYPTO_zalloc((size_t)in_RDI,(char *)in_RDI,(int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  if (md == (EVP_MD *)0x0) {
    return (void *)0x0;
  }
  memcpy(md,in_RDI,0x188);
  md->flags = 0;
  md[1].prov = (OSSL_PROVIDER *)0x0;
  *(undefined8 *)&md[1].refcnt = 0;
  if (((*(long *)((long)in_RDI + 0x10) == 0) ||
      (iVar1 = EC_KEY_up_ref(*(EC_KEY **)((long)in_RDI + 0x10)), iVar1 != 0)) &&
     ((md->flags = *(unsigned_long *)((long)in_RDI + 0x10), *(long *)((long)in_RDI + 0x160) == 0 ||
      (iVar1 = EVP_MD_up_ref(md), iVar1 != 0)))) {
    md[1].prov = *(OSSL_PROVIDER **)((long)in_RDI + 0x160);
    if (*(long *)((long)in_RDI + 0x168) != 0) {
      pEVar2 = EVP_MD_CTX_new();
      *(EVP_MD_CTX **)&md[1].refcnt = pEVar2;
      if ((*(long *)&md[1].refcnt == 0) ||
         (iVar1 = EVP_MD_CTX_copy_ex(*(EVP_MD_CTX **)&md[1].refcnt,
                                     *(EVP_MD_CTX **)((long)in_RDI + 0x168)), iVar1 == 0))
      goto LAB_0034b5b1;
    }
    if (*(long *)((long)in_RDI + 0x178) == 0) {
      return md;
    }
    puVar3 = (undefined1 *)
             CRYPTO_malloc((int)*(undefined8 *)((long)in_RDI + 0x180),
                           "providers/implementations/signature/sm2_sig.c",0x16f);
    md[1].newctx = puVar3;
    if (md[1].newctx != (undefined1 *)0x0) {
      md[1].dinit = *(undefined1 **)((long)in_RDI + 0x180);
      memcpy(md[1].newctx,*(void **)((long)in_RDI + 0x178),*(size_t *)((long)in_RDI + 0x180));
      return md;
    }
  }
LAB_0034b5b1:
  sm2sig_freectx(md);
  return (void *)0x0;
}

Assistant:

static void *sm2sig_dupctx(void *vpsm2ctx)
{
    PROV_SM2_CTX *srcctx = (PROV_SM2_CTX *)vpsm2ctx;
    PROV_SM2_CTX *dstctx;

    dstctx = OPENSSL_zalloc(sizeof(*srcctx));
    if (dstctx == NULL)
        return NULL;

    *dstctx = *srcctx;
    dstctx->ec = NULL;
    dstctx->md = NULL;
    dstctx->mdctx = NULL;

    if (srcctx->ec != NULL && !EC_KEY_up_ref(srcctx->ec))
        goto err;
    dstctx->ec = srcctx->ec;

    if (srcctx->md != NULL && !EVP_MD_up_ref(srcctx->md))
        goto err;
    dstctx->md = srcctx->md;

    if (srcctx->mdctx != NULL) {
        dstctx->mdctx = EVP_MD_CTX_new();
        if (dstctx->mdctx == NULL
                || !EVP_MD_CTX_copy_ex(dstctx->mdctx, srcctx->mdctx))
            goto err;
    }

    if (srcctx->id != NULL) {
        dstctx->id = OPENSSL_malloc(srcctx->id_len);
        if (dstctx->id == NULL)
            goto err;
        dstctx->id_len = srcctx->id_len;
        memcpy(dstctx->id, srcctx->id, srcctx->id_len);
    }

    return dstctx;
 err:
    sm2sig_freectx(dstctx);
    return NULL;
}